

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar_pre.h
# Opt level: O3

void __thiscall Logger::~Logger(Logger *this)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  depth_ = depth_ + -1;
  Indent(this);
  iVar1 = std::uncaught_exceptions();
  pcVar3 = "SUCCESS: ";
  if (0 < iVar1) {
    pcVar3 = "FAIL: ";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,pcVar3,(ulong)(iVar1 < 1) * 3 + 6);
  pcVar3 = this->name_;
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x140368);
  }
  else {
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return;
}

Assistant:

~Logger() {
        --depth_;
        Indent();
        if (std::uncaught_exceptions() > 0) {
            std::cerr << "FAIL: ";
        } else {
            std::cerr << "SUCCESS: ";
        }
        std::cerr << name_ << std::endl;
    }